

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O2

RationalNum operator/(RationalNum *left,RationalNum *right)

{
  RationalNum RVar1;
  RationalNum temp_2;
  RationalNum temp_1;
  RationalNum local_30;
  RationalNum local_20;
  
  RationalNum::RationalNum(&local_20,(long)(int)left->numerator,(long)(int)left->denominator);
  RationalNum::RationalNum(&local_30,(long)(int)right->denominator,(long)(int)right->numerator);
  RVar1 = operator*(&local_20,&local_30);
  return RVar1;
}

Assistant:

RationalNum operator/(const RationalNum &left, const RationalNum &right) {
    RationalNum temp_1(left.getNumerator(), left.getDenominator());
    RationalNum temp_2(right.getDenominator(), right.getNumerator());
    return temp_1 * temp_2;
}